

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>
                   (string *__return_storage_ptr__,char (*a) [84],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [10],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char *args_2)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_1d8;
  cmAlphaNum local_1a0;
  cmAlphaNum local_168;
  cmAlphaNum local_130;
  cmAlphaNum local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char *local_38;
  char *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  char (*a_local) [84];
  
  local_38 = args_2;
  args_local_2 = (char *)args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [10])b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (char (*) [84])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_f8,*a);
  cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_c0,
             &cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_f8);
  cmAlphaNum::cmAlphaNum(&local_130,(string *)args_local);
  cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_130);
  cmAlphaNum::cmAlphaNum(&local_168,(char *)args_local_1);
  cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_168);
  cmAlphaNum::cmAlphaNum(&local_1a0,(string *)args_local_2);
  cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_1a0);
  cmAlphaNum::cmAlphaNum(&local_1d8,*local_38);
  cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[84],std::__cxx11::string_const&,char_const(&)[10],std::__cxx11::string_const&,char>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string_const&,char&&)
              ::makePair,&local_1d8);
  local_48 = &local_c0;
  local_40 = 5;
  views._M_len = 5;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}